

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heterogeneous_queue.hpp
# Opt level: O0

type __thiscall
libtorrent::heterogeneous_queue<libtorrent::alert>::
emplace_back<libtorrent::dht_stats_alert,libtorrent::aux::stack_allocator&,std::vector<libtorrent::dht_routing_bucket,std::allocator<libtorrent::dht_routing_bucket>>,std::vector<libtorrent::dht_lookup,std::allocator<libtorrent::dht_lookup>>,libtorrent::digest32<160l>&,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>&>
          (heterogeneous_queue<libtorrent::alert> *this,stack_allocator *args,
          vector<libtorrent::dht_routing_bucket,_std::allocator<libtorrent::dht_routing_bucket>_>
          *args_1,vector<libtorrent::dht_lookup,_std::allocator<libtorrent::dht_lookup>_> *args_2,
          digest32<160L> *args_3,basic_endpoint<boost::asio::ip::udp> *args_4)

{
  sha1_hash id;
  size_t this_00;
  vector<libtorrent::dht_routing_bucket,_std::allocator<libtorrent::dht_routing_bucket>_> *pvVar1;
  pointer pcVar2;
  size_t sVar3;
  basic_endpoint<boost::asio::ip::udp> local_c4;
  undefined8 local_a8;
  undefined8 uStack_a0;
  uint local_98;
  vector<libtorrent::dht_lookup,_std::allocator<libtorrent::dht_lookup>_> local_88;
  vector<libtorrent::dht_routing_bucket,_std::allocator<libtorrent::dht_routing_bucket>_> local_70;
  dht_stats_alert *ret;
  header_t *hdr;
  size_t pad_bytes;
  char *ptr;
  basic_endpoint<boost::asio::ip::udp> *args_local_4;
  digest32<160L> *args_local_3;
  vector<libtorrent::dht_lookup,_std::allocator<libtorrent::dht_lookup>_> *args_local_2;
  vector<libtorrent::dht_routing_bucket,_std::allocator<libtorrent::dht_routing_bucket>_>
  *args_local_1;
  stack_allocator *args_local;
  heterogeneous_queue<libtorrent::alert> *this_local;
  
  ptr = (char *)args_4;
  args_local_4 = (basic_endpoint<boost::asio::ip::udp> *)args_3;
  args_local_3 = (digest32<160L> *)args_2;
  args_local_2 = (vector<libtorrent::dht_lookup,_std::allocator<libtorrent::dht_lookup>_> *)args_1;
  args_local_1 = (vector<libtorrent::dht_routing_bucket,_std::allocator<libtorrent::dht_routing_bucket>_>
                  *)args;
  args_local = (stack_allocator *)this;
  if ((ulong)(long)this->m_capacity < (long)this->m_size + 0x88U) {
    grow_capacity(this,0x88);
  }
  pcVar2 = ::std::unique_ptr<char,_libtorrent::aux::free_deleter>::get(&this->m_storage);
  pad_bytes = (size_t)(pcVar2 + this->m_size);
  hdr = (header_t *)libtorrent::aux::calculate_pad_bytes((char *)(pad_bytes + 0x10),8);
  ret = (dht_stats_alert *)pad_bytes;
  *(char *)(pad_bytes + 2) = (char)hdr;
  *(code **)(pad_bytes + 8) = move<libtorrent::dht_stats_alert>;
  pad_bytes = (long)&hdr[1].len + pad_bytes;
  sVar3 = libtorrent::aux::calculate_pad_bytes((char *)(pad_bytes + 0x70),8);
  pvVar1 = args_local_1;
  this_00 = pad_bytes;
  *(short *)&(ret->super_alert)._vptr_alert = (short)sVar3 + 0x70;
  ::std::vector<libtorrent::dht_routing_bucket,_std::allocator<libtorrent::dht_routing_bucket>_>::
  vector(&local_70,
         (vector<libtorrent::dht_routing_bucket,_std::allocator<libtorrent::dht_routing_bucket>_> *)
         args_local_2);
  ::std::vector<libtorrent::dht_lookup,_std::allocator<libtorrent::dht_lookup>_>::vector
            (&local_88,
             (vector<libtorrent::dht_lookup,_std::allocator<libtorrent::dht_lookup>_> *)args_local_3
            );
  local_98 = *(uint *)((long)&(args_local_4->impl_).data_ + 0x10);
  local_a8 = *(undefined8 *)&(args_local_4->impl_).data_;
  uStack_a0 = *(undefined8 *)((long)&(args_local_4->impl_).data_ + 8);
  boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::basic_endpoint
            (&local_c4,(basic_endpoint<boost::asio::ip::udp> *)ptr);
  id.m_number._M_elems[2] = (undefined4)uStack_a0;
  id.m_number._M_elems[3] = uStack_a0._4_4_;
  id.m_number._M_elems[0] = (undefined4)local_a8;
  id.m_number._M_elems[1] = local_a8._4_4_;
  id.m_number._M_elems[4] = local_98;
  dht_stats_alert::dht_stats_alert
            ((dht_stats_alert *)this_00,(stack_allocator *)pvVar1,&local_70,&local_88,id,&local_c4);
  ::std::vector<libtorrent::dht_lookup,_std::allocator<libtorrent::dht_lookup>_>::~vector(&local_88)
  ;
  ::std::vector<libtorrent::dht_routing_bucket,_std::allocator<libtorrent::dht_routing_bucket>_>::
  ~vector(&local_70);
  this->m_num_items = this->m_num_items + 1;
  this->m_size = (int)hdr + 0x10 + (uint)*(ushort *)&(ret->super_alert)._vptr_alert + this->m_size;
  return (type)this_00;
}

Assistant:

typename std::enable_if<std::is_base_of<T, U>::value, U&>::type
		emplace_back(Args&&... args)
		{
			// make the conservative assumption that we'll need the maximum padding
			// for this object, just for purposes of growing the storage
			if (std::size_t(m_size) + sizeof(header_t) + alignof(U) + sizeof(U) > std::size_t(m_capacity))
				grow_capacity(sizeof(header_t) + alignof(U) + sizeof(U));

			char* ptr = m_storage.get() + m_size;

			std::size_t const pad_bytes = aux::calculate_pad_bytes(ptr + sizeof(header_t), alignof(U));

			// pad_bytes is only 8 bits in the header, so types that need more than
			// 256 byte alignment may not be supported
			static_assert(alignof(U) <= 256
				, "heterogeneous_queue does not support types with alignment requirements > 256");

#ifdef TORRENT_ADDRESS_SANITIZER
			std::size_t const hdr_len = sizeof(U)
				+ aux::calculate_pad_bytes(ptr + sizeof(header_t) + pad_bytes + sizeof(U)
					, alignof(header_t));

			int const new_size = m_size + int(sizeof(header_t) + pad_bytes + hdr_len);

			__sanitizer_annotate_contiguous_container(
				m_storage.get()
				, m_storage.get() + m_capacity
				, ptr
				, m_storage.get() + new_size);
#endif

			// if this assert triggers, the type being added to the queue has
			// alignment requirements stricter than what malloc() returns. This is
			// not supported
			TORRENT_ASSERT((reinterpret_cast<std::uintptr_t>(m_storage.get())
				& (alignof(U) - 1)) == 0);

			// make sure the current position in the storage is aligned for
			// creating a heder_t object
			TORRENT_ASSERT((reinterpret_cast<std::uintptr_t>(ptr)
				& (alignof(header_t) - 1)) == 0);

			// length prefix
			header_t* hdr = new (ptr) header_t;
			hdr->pad_bytes = static_cast<std::uint8_t>(pad_bytes);
			hdr->move = &move<U>;
			ptr += sizeof(header_t) + pad_bytes;
			hdr->len = static_cast<std::uint16_t>(sizeof(U)
				+ aux::calculate_pad_bytes(ptr + sizeof(U), alignof(header_t)));

			// make sure ptr is correctly aligned for the object we're about to
			// create there
			TORRENT_ASSERT((reinterpret_cast<std::uintptr_t>(ptr)
				& (alignof(U) - 1)) == 0);

			// construct in-place
			U* const ret = new (ptr) U(std::forward<Args>(args)...);

			// if we constructed the object without throwing any exception
			// update counters to indicate the new item is in there
			++m_num_items;
			m_size += int(sizeof(header_t) + pad_bytes + hdr->len);
#ifdef TORRENT_ADDRESS_SANITIZER
			TORRENT_ASSERT(m_size == new_size);
#endif
			return *ret;
		}